

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O0

Result<wallet::SelectionResult> *
wallet::KnapsackSolver
          (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *groups,
          CAmount *nTargetValue,CAmount change_target,FastRandomContext *rng,
          int max_selection_weight)

{
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  reference pOVar5;
  CAmount CVar6;
  iterator iVar7;
  iterator iVar8;
  CAmount CVar9;
  ulong n;
  size_type sVar10;
  reference pvVar11;
  ulong uVar12;
  long in_RCX;
  long *in_RDX;
  Result<wallet::SelectionResult> *in_RDI;
  int in_R9D;
  long in_FS_OFFSET;
  uint i_1;
  uint i;
  OutputGroup *group_1;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *__range2;
  OutputGroup *group;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *__range1;
  bool max_weight_exceeded;
  CAmount nBest;
  vector<char,_std::allocator<char>_> vfBest;
  iterator __end2;
  iterator __begin2;
  iterator __end1;
  iterator __begin1;
  CAmount nTotalLower;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> applicable_groups;
  optional<wallet::OutputGroup> lowest_larger;
  string log_message;
  SelectionResult result;
  int in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa8c;
  SelectionResult *in_stack_fffffffffffffa90;
  char *obj;
  SelectionResult *in_stack_fffffffffffffa98;
  char *in_stack_fffffffffffffaa0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffaa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab0;
  char *in_stack_fffffffffffffab8;
  allocator<char> *in_stack_fffffffffffffac8;
  CAmount *in_stack_fffffffffffffad0;
  allocator<char> *__s;
  undefined4 in_stack_fffffffffffffad8;
  undefined4 uVar13;
  undefined4 in_stack_fffffffffffffadc;
  CAmount *in_stack_fffffffffffffae0;
  CAmount *in_stack_fffffffffffffae8;
  FastRandomContext *in_stack_fffffffffffffaf0;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *groups_00;
  FastRandomContext *insecure_rand;
  CAmount in_stack_fffffffffffffb30;
  ConstevalFormatString<2U> in_stack_fffffffffffffb38;
  __normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
  in_stack_fffffffffffffb40;
  __normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
  in_stack_fffffffffffffb48;
  Result<wallet::SelectionResult> *pRVar14;
  uint local_494;
  uint local_490;
  allocator<char> local_3d1;
  Level level;
  long in_stack_fffffffffffffc30;
  long local_3c8;
  pointer in_stack_fffffffffffffc40;
  pointer in_stack_fffffffffffffc48;
  long local_388;
  FastRandomContext local_380;
  char local_288 [96];
  SelectionResult local_228;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar14 = in_RDI;
  SelectionResult::SelectionResult
            (in_stack_fffffffffffffa98,(CAmount)in_stack_fffffffffffffa90,
             (SelectionAlgorithm)((uint)in_stack_fffffffffffffa8c >> 0x18));
  bVar2 = false;
  std::optional<wallet::OutputGroup>::optional
            ((optional<wallet::OutputGroup> *)
             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::vector
            ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  local_388 = 0;
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::begin
            ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
             in_stack_fffffffffffffa90);
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::end
            ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
             in_stack_fffffffffffffa90);
  std::
  shuffle<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,FastRandomContext&>
            (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,in_stack_fffffffffffffaf0);
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::begin
            ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
             in_stack_fffffffffffffa90);
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::end
            ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
             in_stack_fffffffffffffa90);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
                      ((__normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
                        *)in_stack_fffffffffffffa98,
                       (__normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
                        *)in_stack_fffffffffffffa90);
    iVar4 = (int)in_stack_fffffffffffffb30;
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pOVar5 = __gnu_cxx::
             __normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
             ::operator*((__normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
                          *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    if (in_R9D < pOVar5->m_weight) {
      bVar2 = true;
    }
    else {
      in_stack_fffffffffffffb48._M_current =
           (OutputGroup *)OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffa98);
      if (in_stack_fffffffffffffb48._M_current == (OutputGroup *)*in_RDX) {
        SelectionResult::AddInput
                  (in_stack_fffffffffffffa98,(OutputGroup *)in_stack_fffffffffffffa90);
        SelectionResult::SelectionResult(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
        util::Result<wallet::SelectionResult>::Result
                  ((Result<wallet::SelectionResult> *)in_stack_fffffffffffffa98,
                   in_stack_fffffffffffffa90);
        SelectionResult::~SelectionResult
                  ((SelectionResult *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88))
        ;
        goto LAB_00bb15c7;
      }
      in_stack_fffffffffffffb38.fmt =
           (char *)OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffa98);
      if ((long)in_stack_fffffffffffffb38.fmt < *in_RDX + in_RCX) {
        std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::push_back
                  ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                   in_stack_fffffffffffffa98,(value_type *)in_stack_fffffffffffffa90);
        in_stack_fffffffffffffb30 =
             OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffa98);
        local_388 = in_stack_fffffffffffffb30 + local_388;
      }
      else {
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional<wallet::OutputGroup> *)
                           CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        if (bVar1) {
          CVar9 = OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffa98);
          std::optional<wallet::OutputGroup>::operator->
                    ((optional<wallet::OutputGroup> *)
                     CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
          CVar6 = OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffa98);
          if (CVar6 <= CVar9) goto LAB_00bb0bde;
        }
        std::optional<wallet::OutputGroup>::operator=
                  ((optional<wallet::OutputGroup> *)in_stack_fffffffffffffa98,
                   (OutputGroup *)in_stack_fffffffffffffa90);
      }
    }
LAB_00bb0bde:
    __gnu_cxx::
    __normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
    ::operator++((__normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
                  *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  }
  if (local_388 == *in_RDX) {
    std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::begin
              ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
               in_stack_fffffffffffffa90);
    std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::end
              ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
               in_stack_fffffffffffffa90);
    while( true ) {
      bVar2 = __gnu_cxx::
              operator==<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
                        ((__normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
                          *)in_stack_fffffffffffffa98,
                         (__normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
                          *)in_stack_fffffffffffffa90);
      iVar4 = (int)in_stack_fffffffffffffb30;
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
      ::operator*((__normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
                   *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      SelectionResult::AddInput(in_stack_fffffffffffffa98,(OutputGroup *)in_stack_fffffffffffffa90);
      __gnu_cxx::
      __normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
      ::operator++((__normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
                    *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    }
    iVar3 = SelectionResult::GetWeight
                      ((SelectionResult *)
                       CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    if (iVar3 <= in_R9D) {
      SelectionResult::SelectionResult(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
      util::Result<wallet::SelectionResult>::Result
                ((Result<wallet::SelectionResult> *)in_stack_fffffffffffffa98,
                 in_stack_fffffffffffffa90);
      SelectionResult::~SelectionResult
                ((SelectionResult *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      goto LAB_00bb15c7;
    }
    bVar2 = true;
    SelectionResult::Clear
              ((SelectionResult *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  }
  if (local_388 < *in_RDX) {
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<wallet::OutputGroup> *)
                       CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    if (bVar1) {
      std::optional<wallet::OutputGroup>::operator*
                ((optional<wallet::OutputGroup> *)
                 CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      SelectionResult::AddInput(in_stack_fffffffffffffa98,(OutputGroup *)in_stack_fffffffffffffa90);
      SelectionResult::SelectionResult(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
      util::Result<wallet::SelectionResult>::Result
                ((Result<wallet::SelectionResult> *)in_stack_fffffffffffffa98,
                 in_stack_fffffffffffffa90);
      SelectionResult::~SelectionResult
                ((SelectionResult *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    }
    else if (bVar2) {
      ErrorMaxWeightExceeded();
    }
    else {
      local_168 = 0;
      uStack_160 = 0;
      local_178 = 0;
      uStack_170 = 0;
      local_188 = 0;
      uStack_180 = 0;
      local_198 = 0;
      uStack_190 = 0;
      util::Error::Error((Error *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      util::Result<wallet::SelectionResult>::Result
                ((Result<wallet::SelectionResult> *)in_stack_fffffffffffffa98,
                 (Error *)in_stack_fffffffffffffa90);
      util::Error::~Error((Error *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    }
    goto LAB_00bb15c7;
  }
  insecure_rand = &local_380;
  iVar7 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::begin
                    ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                     in_stack_fffffffffffffa90);
  iVar8 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::end
                    ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                     in_stack_fffffffffffffa90);
  uVar13 = (undefined4)((ulong)in_stack_fffffffffffffa90 >> 0x20);
  std::
  sort<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,wallet::__0>
            (iVar7._M_current,iVar8._M_current);
  groups_00 = (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
              &stack0xfffffffffffffc40;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  obj = (char *)CONCAT44(uVar13,1000);
  in_stack_fffffffffffffa88 = in_R9D;
  ApproximateBestSubset
            (insecure_rand,groups_00,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
             (vector<char,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),in_stack_fffffffffffffad0
             ,iVar4,(int)in_stack_fffffffffffffb38.fmt);
  if ((local_3c8 != *in_RDX) && (*in_RDX + in_RCX <= local_388)) {
    in_stack_fffffffffffffc30 = *in_RDX + in_RCX;
    obj = (char *)CONCAT44((int)((ulong)obj >> 0x20),1000);
    in_stack_fffffffffffffa88 = in_R9D;
    ApproximateBestSubset
              (insecure_rand,groups_00,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
               (vector<char,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
               in_stack_fffffffffffffad0,iVar4,(int)in_stack_fffffffffffffb38.fmt);
  }
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<wallet::OutputGroup> *)
                     CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  if (bVar2) {
    if ((local_3c8 == *in_RDX) || (*in_RDX + in_RCX <= local_3c8)) {
      std::optional<wallet::OutputGroup>::operator->
                ((optional<wallet::OutputGroup> *)
                 CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      CVar9 = OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffa98);
      if (local_3c8 < CVar9) goto LAB_00bb10d2;
    }
    std::optional<wallet::OutputGroup>::operator*
              ((optional<wallet::OutputGroup> *)
               CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    SelectionResult::AddInput(in_stack_fffffffffffffa98,(OutputGroup *)obj);
LAB_00bb14e9:
    SelectionResult::GetWeight
              ((SelectionResult *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    inline_assertion_check<false,bool>
              ((bool *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
               (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),obj,
               (char *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    SelectionResult::SelectionResult(in_stack_fffffffffffffa98,(SelectionResult *)obj);
    util::Result<wallet::SelectionResult>::Result
              ((Result<wallet::SelectionResult> *)in_stack_fffffffffffffa98,(T *)obj);
    SelectionResult::~SelectionResult
              ((SelectionResult *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  }
  else {
LAB_00bb10d2:
    local_490 = 0;
    while( true ) {
      n = (ulong)local_490;
      sVar10 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::size
                         ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                          CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      if (sVar10 <= n) break;
      pvVar11 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffa98,
                           (size_type)obj);
      if (*pvVar11 != '\0') {
        std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::operator[]
                  ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                   in_stack_fffffffffffffa98,(size_type)obj);
        SelectionResult::AddInput(in_stack_fffffffffffffa98,(OutputGroup *)obj);
      }
      local_490 = local_490 + 1;
    }
    iVar4 = SelectionResult::GetWeight
                      ((SelectionResult *)
                       CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    if (iVar4 <= in_R9D) {
LAB_00bb11dd:
      bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                                  Trace);
      uVar13 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffad8);
      if (bVar2) {
        __s = &local_3d1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar4,uVar13),(char *)__s,in_stack_fffffffffffffac8);
        std::allocator<char>::~allocator(&local_3d1);
        local_494 = 0;
        while( true ) {
          uVar12 = (ulong)local_494;
          sVar10 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::size
                             ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                              CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
          level = (Level)in_stack_fffffffffffffc30;
          iVar4 = (int)((ulong)insecure_rand >> 0x20);
          if (sVar10 <= uVar12) break;
          pvVar11 = std::vector<char,_std::allocator<char>_>::operator[]
                              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffa98,
                               (size_type)obj);
          if (*pvVar11 != '\0') {
            std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::operator[]
                      ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                       in_stack_fffffffffffffa98,(size_type)obj);
            FormatMoney_abi_cxx11_(n);
            tinyformat::format<std::__cxx11::string>
                      (in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffa98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)obj);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
          }
          local_494 = local_494 + 1;
        }
        bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                                    Trace);
        if (bVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
          FormatMoney_abi_cxx11_(n);
          in_stack_fffffffffffffaa0 = local_288;
          in_stack_fffffffffffffa98 = &local_228;
          obj = "%stotal %s\n";
          in_stack_fffffffffffffa88 = 1;
          logging_function._M_str = (char *)pRVar14;
          logging_function._M_len = (size_t)in_RDI;
          source_file._M_str = (char *)in_stack_fffffffffffffb48._M_current;
          source_file._M_len = (size_t)in_stack_fffffffffffffb40._M_current;
          LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                    (logging_function,source_file,iVar4,(LogFlags)groups_00,level,
                     in_stack_fffffffffffffb38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc48);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      }
      goto LAB_00bb14e9;
    }
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<wallet::OutputGroup> *)
                       CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    if (bVar2) {
      SelectionResult::Clear
                ((SelectionResult *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      std::optional<wallet::OutputGroup>::operator*
                ((optional<wallet::OutputGroup> *)
                 CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      SelectionResult::AddInput(in_stack_fffffffffffffa98,(OutputGroup *)obj);
      goto LAB_00bb11dd;
    }
    ErrorMaxWeightExceeded();
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffa98);
LAB_00bb15c7:
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::~vector
            ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
             in_stack_fffffffffffffa98);
  std::optional<wallet::OutputGroup>::~optional
            ((optional<wallet::OutputGroup> *)
             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  SelectionResult::~SelectionResult
            ((SelectionResult *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pRVar14;
}

Assistant:

util::Result<SelectionResult> KnapsackSolver(std::vector<OutputGroup>& groups, const CAmount& nTargetValue,
                                             CAmount change_target, FastRandomContext& rng, int max_selection_weight)
{
    SelectionResult result(nTargetValue, SelectionAlgorithm::KNAPSACK);

    bool max_weight_exceeded{false};
    // List of values less than target
    std::optional<OutputGroup> lowest_larger;
    // Groups with selection amount smaller than the target and any change we might produce.
    // Don't include groups larger than this, because they will only cause us to overshoot.
    std::vector<OutputGroup> applicable_groups;
    CAmount nTotalLower = 0;

    std::shuffle(groups.begin(), groups.end(), rng);

    for (const OutputGroup& group : groups) {
        if (group.m_weight > max_selection_weight) {
            max_weight_exceeded = true;
            continue;
        }
        if (group.GetSelectionAmount() == nTargetValue) {
            result.AddInput(group);
            return result;
        } else if (group.GetSelectionAmount() < nTargetValue + change_target) {
            applicable_groups.push_back(group);
            nTotalLower += group.GetSelectionAmount();
        } else if (!lowest_larger || group.GetSelectionAmount() < lowest_larger->GetSelectionAmount()) {
            lowest_larger = group;
        }
    }

    if (nTotalLower == nTargetValue) {
        for (const auto& group : applicable_groups) {
            result.AddInput(group);
        }
        if (result.GetWeight() <= max_selection_weight) return result;
        else max_weight_exceeded = true;

        // Try something else
        result.Clear();
    }

    if (nTotalLower < nTargetValue) {
        if (!lowest_larger) {
            if (max_weight_exceeded) return ErrorMaxWeightExceeded();
            return util::Error();
        }
        result.AddInput(*lowest_larger);
        return result;
    }

    // Solve subset sum by stochastic approximation
    std::sort(applicable_groups.begin(), applicable_groups.end(), descending);
    std::vector<char> vfBest;
    CAmount nBest;

    ApproximateBestSubset(rng, applicable_groups, nTotalLower, nTargetValue, vfBest, nBest, max_selection_weight);
    if (nBest != nTargetValue && nTotalLower >= nTargetValue + change_target) {
        ApproximateBestSubset(rng, applicable_groups, nTotalLower, nTargetValue + change_target, vfBest, nBest, max_selection_weight);
    }

    // If we have a bigger coin and (either the stochastic approximation didn't find a good solution,
    //                                   or the next bigger coin is closer), return the bigger coin
    if (lowest_larger &&
        ((nBest != nTargetValue && nBest < nTargetValue + change_target) || lowest_larger->GetSelectionAmount() <= nBest)) {
        result.AddInput(*lowest_larger);
    } else {
        for (unsigned int i = 0; i < applicable_groups.size(); i++) {
            if (vfBest[i]) {
                result.AddInput(applicable_groups[i]);
            }
        }

        // If the result exceeds the maximum allowed size, return closest UTXO above the target
        if (result.GetWeight() > max_selection_weight) {
            // No coin above target, nothing to do.
            if (!lowest_larger) return ErrorMaxWeightExceeded();

            // Return closest UTXO above target
            result.Clear();
            result.AddInput(*lowest_larger);
        }

        if (LogAcceptCategory(BCLog::SELECTCOINS, BCLog::Level::Debug)) {
            std::string log_message{"Coin selection best subset: "};
            for (unsigned int i = 0; i < applicable_groups.size(); i++) {
                if (vfBest[i]) {
                    log_message += strprintf("%s ", FormatMoney(applicable_groups[i].m_value));
                }
            }
            LogDebug(BCLog::SELECTCOINS, "%stotal %s\n", log_message, FormatMoney(nBest));
        }
    }
    Assume(result.GetWeight() <= max_selection_weight);
    return result;
}